

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec2.c
# Opt level: O0

bool_t ec2ToALD(word *b,word *a,ec_o *ec,void *stack)

{
  long lVar1;
  bool_t bVar2;
  long lVar3;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  word *t1;
  size_t n;
  undefined4 local_4;
  
  lVar1 = *(long *)(*(long *)(in_RDX + 0x18) + 0x30);
  lVar3 = in_RCX + lVar1 * 8;
  bVar2 = wwIsZero((word *)(in_RSI + lVar1 * 0x10),*(size_t *)(*(long *)(in_RDX + 0x18) + 0x30));
  if (bVar2 == 0) {
    (**(code **)(*(long *)(in_RDX + 0x18) + 0x78))
              (in_RCX,in_RSI + lVar1 * 0x10,*(undefined8 *)(in_RDX + 0x18),lVar3);
    (**(code **)(*(long *)(in_RDX + 0x18) + 0x68))
              (in_RDI,in_RSI,in_RCX,*(undefined8 *)(in_RDX + 0x18),lVar3);
    (**(code **)(*(long *)(in_RDX + 0x18) + 0x70))
              (in_RCX,in_RCX,*(undefined8 *)(in_RDX + 0x18),lVar3);
    (**(code **)(*(long *)(in_RDX + 0x18) + 0x68))
              (in_RDI + lVar1 * 8,in_RSI + lVar1 * 8,in_RCX,*(undefined8 *)(in_RDX + 0x18),lVar3);
  }
  local_4 = (uint)(bVar2 == 0);
  return local_4;
}

Assistant:

static bool_t ec2ToALD(word b[], const word a[], const ec_o* ec, void* stack)
{
	const size_t n = ec->f->n;
	// переменные в stack
	word* t1 = (word*)stack;
	stack = t1 + n;
	// pre
	ASSERT(ecIsOperable(ec) && ec->d == 3);
	ASSERT(ec2SeemsOn3(a, ec));
	ASSERT(a == b || wwIsDisjoint2(a, 3 * n, b, 2 * n));
	// a == O => b <- O
	if (qrIsZero(ecZ(a, n), ec->f))
		return FALSE;
	// t1 <- za^{-1}
	qrInv(t1, ecZ(a, n), ec->f, stack);
	// xb <- xa t1
	qrMul(ecX(b), ecX(a), t1, ec->f, stack);
	// t1 <- t1^2
	qrSqr(t1, t1, ec->f, stack);
	// yb <- ya t1
	qrMul(ecY(b, n), ecY(a, n), t1, ec->f, stack);
	// b != O
	return TRUE;
}